

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.hpp
# Opt level: O1

double webfront::log::anon_unknown_3::log(double __x)

{
  pointer pfVar1;
  _Alloc_hider _Var2;
  path *ppVar3;
  path *ppVar4;
  long *in_RDX;
  function<void_(std::basic_string_view<char,_std::char_traits<char>_>)> *s_1;
  pointer pfVar5;
  double extraout_XMM0_Qa;
  string_view fmt;
  char local_f9;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_f8;
  uint local_ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  path local_a8;
  string_view text_local;
  size_type local_70;
  pointer local_68;
  path local_60;
  char *local_38;
  
  local_f9 = 'D';
  local_f8.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  if ((undefined8 *)*in_RDX == (undefined8 *)0x0) {
    local_38 = "";
  }
  else {
    local_38 = *(char **)*in_RDX;
  }
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            (&local_a8,&local_38,auto_format);
  if (local_a8._M_pathname._M_string_length != 0) {
    ppVar3 = &local_a8;
    if ((~local_a8._M_cmpts & 3) == 0) {
LAB_00145240:
      http::std::filesystem::__cxx11::path::path(&local_60,(path *)ppVar3);
      goto LAB_0014525f;
    }
    if (((local_a8._32_8_ & 3) == 0) &&
       (local_a8._M_pathname._M_dataplus._M_p[local_a8._M_pathname._M_string_length - 1] != '/')) {
      if ((local_a8._32_8_ & 3) == 0) {
        ppVar3 = (path *)std::filesystem::__cxx11::path::_List::end();
      }
      else {
        ppVar3 = (path *)0x0;
      }
      ppVar4 = (path *)&ppVar3[-2]._M_cmpts;
      if ((local_a8._32_8_ & 3) != 0) {
        ppVar4 = ppVar3;
      }
      ppVar3 = &local_a8;
      if ((local_a8._32_8_ & 3) == 0) {
        ppVar3 = ppVar4;
      }
      if ((~*(uint *)&ppVar3->_M_cmpts & 3) == 0) {
        ppVar3 = &local_a8;
        if ((local_a8._32_8_ & 3) == 0) {
          ppVar3 = ppVar4;
        }
        goto LAB_00145240;
      }
    }
  }
  http::std::filesystem::__cxx11::path::path(&local_60);
LAB_0014525f:
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,local_60._M_pathname._M_dataplus._M_p,
             local_60._M_pathname._M_dataplus._M_p + local_60._M_pathname._M_string_length);
  if (*in_RDX == 0) {
    local_ec = 0;
  }
  else {
    local_ec = *(uint *)(*in_RDX + 0x10);
  }
  fmt._M_str = "[{}] {:%T} | {:16}:{:4} | {}";
  fmt._M_len = 0x1c;
  std::
  format<char,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::__cxx11::string,unsigned_int,std::basic_string_view<char,std::char_traits<char>>&>
            (&local_c8,fmt,&local_f9,&local_f8,&local_e8,&local_ec,
             (basic_string_view<char,_std::char_traits<char>_> *)&text_local);
  _Var2._M_p = local_c8._M_dataplus._M_p;
  pfVar1 = Sinks::sinks.
           super__Vector_base<std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (Sinks::sinks.
      super__Vector_base<std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      Sinks::sinks.
      super__Vector_base<std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pfVar5 = Sinks::sinks.
             super__Vector_base<std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (*(long *)(pfVar5 + 0x10) != 0) {
        local_70 = local_c8._M_string_length;
        local_68 = _Var2._M_p;
        (**(code **)(pfVar5 + 0x18))(pfVar5,&local_70);
      }
      pfVar5 = pfVar5 + 0x20;
    } while (pfVar5 != pfVar1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  http::std::filesystem::__cxx11::path::~path(&local_60);
  http::std::filesystem::__cxx11::path::~path((path *)&local_a8);
  return extraout_XMM0_Qa;
}

Assistant:

inline static void log(LogType l, string_view text, const srcLoc& s) {
        out(format("[{}] {:%T} | {:16}:{:4} | {}", toChar(l), chrono::system_clock::now(), filesystem::path(s.file_name()).filename().string(), s.line(), text));
    }